

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

void Gia_ManDupWithConstrCollectAnd_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSuper,int fFirst)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  long lVar4;
  
  do {
    if (((ulong)pObj & 1) == 0) {
      if (((~*(uint *)pObj & 0x1fffffff) == 0 || (int)*(uint *)pObj < 0) && fFirst == 0)
      goto LAB_001efe56;
    }
    else if (fFirst == 0) {
LAB_001efe56:
      pGVar3 = (Gia_Obj_t *)((ulong)pObj & 0xfffffffffffffffe);
      pGVar1 = p->pObjs;
      if ((pGVar1 <= pGVar3) && (pGVar3 < pGVar1 + p->nObjs)) {
        iVar2 = (int)((ulong)((long)pGVar3 - (long)pGVar1) >> 2);
        if (iVar2 * -0x55555555 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        iVar2 = ((uint)pObj & 1) + iVar2 * 0x55555556;
        if (0 < (long)vSuper->nSize) {
          lVar4 = 0;
          do {
            if (vSuper->pArray[lVar4] == iVar2) {
              return;
            }
            lVar4 = lVar4 + 1;
          } while (vSuper->nSize != lVar4);
        }
        Vec_IntPush(vSuper,iVar2);
        return;
      }
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    fFirst = 0;
    Gia_ManDupWithConstrCollectAnd_rec
              (p,(Gia_Obj_t *)
                 ((ulong)((uint)(*(ulong *)pObj >> 0x1d) & 1) ^
                 (ulong)(pObj + -(*(ulong *)pObj & 0x1fffffff))),vSuper,0);
    pObj = (Gia_Obj_t *)
           ((ulong)((uint)(*(ulong *)pObj >> 0x3d) & 1) ^
           (ulong)(pObj + -(*(ulong *)pObj >> 0x20 & 0x1fffffff)));
  } while( true );
}

Assistant:

void Gia_ManDupWithConstrCollectAnd_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSuper, int fFirst )
{
    if ( (Gia_IsComplement(pObj) || !Gia_ObjIsAnd(pObj)) && !fFirst )
    {
        Vec_IntPushUnique( vSuper, Gia_ObjToLit(p, pObj) );
        return;
    }
    Gia_ManDupWithConstrCollectAnd_rec( p, Gia_ObjChild0(pObj), vSuper, 0 );
    Gia_ManDupWithConstrCollectAnd_rec( p, Gia_ObjChild1(pObj), vSuper, 0 );
}